

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_gamma.c
# Opt level: O0

float FromLinearPq(float linear)

{
  float in_XMM0_Da;
  float den;
  float num;
  float pow_linear;
  undefined4 local_4;
  
  if (in_XMM0_Da <= 0.0) {
    local_4 = 0.0;
  }
  else {
    Powf(0.0,2.698137e-39);
    local_4 = Powf(0.0,2.698281e-39);
  }
  return local_4;
}

Assistant:

static float FromLinearPq(float linear) {
  if (linear > 0.f) {
    const float pow_linear = Powf(linear, 653.f / 4096.f);
    const float num = 107.f / 128.f + 2413.f / 128.f * pow_linear;
    const float den = 1.0f + 2392.f / 128.f * pow_linear;
    return Powf(num / den, 2523.f / 32.f);
  }
  return 0.f;
}